

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O2

void __thiscall
irr::gui::CGUITab::CGUITab
          (CGUITab *this,IGUIEnvironment *environment,IGUIElement *parent,rect<int> *rectangle,
          s32 id)

{
  int iVar1;
  u32 uVar2;
  undefined4 extraout_var;
  undefined8 *puVar3;
  
  *(undefined ***)&this->field_0x148 = &PTR__IReferenceCounted_0027ba48;
  *(undefined8 *)&this->field_0x150 = 0;
  *(undefined4 *)&this->field_0x158 = 1;
  IGUITab::IGUITab((IGUITab *)this,&PTR_construction_vtable_24__0028da38,environment,parent,id,
                   *rectangle);
  *(undefined8 *)this = 0x28d8b8;
  *(undefined8 *)&this->field_0x148 = 0x28da20;
  (this->BackColor).color = 0;
  this->OverrideTextColorEnabled = false;
  (this->TextColor).color = 0xff000000;
  this->DrawBackground = false;
  iVar1 = (*environment->_vptr_IGUIEnvironment[0xc])(environment);
  puVar3 = (undefined8 *)CONCAT44(extraout_var,iVar1);
  if (puVar3 != (undefined8 *)0x0) {
    uVar2 = (**(code **)*puVar3)(puVar3,8);
    (this->TextColor).color = uVar2;
  }
  return;
}

Assistant:

CGUITab::CGUITab(IGUIEnvironment *environment,
		IGUIElement *parent, const core::rect<s32> &rectangle,
		s32 id) :
		IGUITab(environment, parent, id, rectangle),
		BackColor(0, 0, 0, 0), OverrideTextColorEnabled(false), TextColor(255, 0, 0, 0),
		DrawBackground(false)
{
#ifdef _DEBUG
	setDebugName("CGUITab");
#endif

	const IGUISkin *const skin = environment->getSkin();
	if (skin)
		TextColor = skin->getColor(EGDC_BUTTON_TEXT);
}